

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_Prewitt(PrewittForm1 Prewitt)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  code *in_RDI;
  Image output;
  Image input;
  uint8_t in_stack_ffffffffffffff4f;
  undefined1 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff51;
  undefined1 in_stack_ffffffffffffff52;
  undefined1 in_stack_ffffffffffffff53;
  undefined2 in_stack_ffffffffffffff54;
  undefined2 uVar4;
  uint8_t in_stack_ffffffffffffff56;
  undefined1 uVar5;
  uint8_t in_stack_ffffffffffffff57;
  undefined1 uVar6;
  uint32_t in_stack_ffffffffffffff58;
  uint32_t width;
  ImageTemplate<unsigned_char> *this;
  undefined1 local_98 [40];
  undefined4 local_70;
  ImageTemplate<unsigned_char> local_60;
  ImageTemplate<unsigned_char> local_38;
  code *local_10;
  byte local_1;
  
  this = &local_60;
  width = 0;
  local_10 = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (this,0,in_stack_ffffffffffffff58,in_stack_ffffffffffffff57,in_stack_ffffffffffffff56);
  Test_Helper::uniformImage
            (width,in_stack_ffffffffffffff58,
             (Image *)CONCAT17(in_stack_ffffffffffffff57,
                               CONCAT16(in_stack_ffffffffffffff56,
                                        CONCAT24(in_stack_ffffffffffffff54,
                                                 CONCAT13(in_stack_ffffffffffffff53,
                                                          CONCAT12(in_stack_ffffffffffffff52,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff51,
                                                  in_stack_ffffffffffffff50)))))));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e65c3);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
  if (2 < uVar2) {
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
    uVar4 = (undefined2)uVar3;
    uVar5 = (undefined1)(uVar3 >> 0x10);
    uVar6 = (undefined1)(uVar3 >> 0x18);
    if (2 < uVar3) {
      (*local_10)(local_98,&local_38);
      bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<unsigned_char>>
                        (this,(ImageTemplate<unsigned_char> *)CONCAT44(width,uVar2));
      local_1 = false;
      if (bVar1) {
        local_1 = Unit_Test::verifyImage
                            ((Image *)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT24(uVar4,CONCAT13(bVar1,(
                                                  uint3)CONCAT11(in_stack_ffffffffffffff51,
                                                                 in_stack_ffffffffffffff50))))),
                             in_stack_ffffffffffffff4f);
      }
      local_70 = 1;
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
                ((ImageTemplate<unsigned_char> *)0x1e66bd);
      goto LAB_001e66d9;
    }
  }
  local_1 = 1;
  local_70 = 1;
LAB_001e66d9:
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e66e6);
  return (bool)(local_1 & 1);
}

Assistant:

bool form1_Prewitt(PrewittForm1 Prewitt)
    {
        const PenguinV_Image::Image input = uniformImage();
        if ( (input.width() < 3) || (input.height() < 3) )
            return true;

        const PenguinV_Image::Image output = Prewitt( input );

        return equalSize( input, output ) && verifyImage( output, 0u );
    }